

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ReportOnFunctionSelectError
               (ExpressionContext *ctx,SynBase *source,char *errorBuf,uint errorBufSize,
               char *messageStart,InplaceStr functionName,ArrayView<FunctionValue> functions,
               IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
               ArrayView<unsigned_int> ratings,uint bestRating,bool showInstanceInfo)

{
  int iVar1;
  TypeHandle *pTVar2;
  long lVar3;
  FunctionData *function;
  TypeBase *pTVar4;
  char *pcVar5;
  ArgumentData *pAVar6;
  undefined8 uVar7;
  TypeStruct *pTVar8;
  Allocator *pAVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  bool bVar12;
  int iVar13;
  MatchData *pMVar14;
  TypeFunction *instance;
  size_t sVar15;
  uint uVar16;
  char *pcVar17;
  char *pcVar18;
  uint k;
  uint index;
  ScopeData *parentType;
  ulong uVar19;
  size_t size;
  ExpressionContext *this;
  ExpressionContext *pEVar20;
  ulong uVar21;
  char *pcVar22;
  IntrusiveList<TypeHandle> *pIVar23;
  long lVar24;
  ArrayView<CallArgumentData> arguments_00;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<CallArgumentData> arguments_02;
  IntrusiveList<MatchData> aliases;
  SmallArray<CallArgumentData,_16U> result;
  IntrusiveList<MatchData> local_168;
  char *local_158;
  FunctionValue *local_150;
  SmallArray<CallArgumentData,_16U> local_148;
  
  local_158 = messageStart;
  if (errorBuf == (char *)0x0) {
    __assert_fail("errorBuf",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x192e,
                  "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                 );
  }
  iVar1 = (int)errorBuf;
  if (functionName.begin != functionName.end) {
    iVar13 = NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,"  %.*s",
                                (ulong)(uint)((int)functionName.end - (int)functionName.begin));
    pcVar22 = errorBuf + iVar13;
    size = (size_t)(errorBufSize - iVar13);
    if (generics.head == (TypeHandle *)0x0) {
      pcVar17 = "(";
    }
    else {
      iVar13 = NULLC::SafeSprintf(pcVar22,size,"<");
      pcVar22 = pcVar22 + iVar13;
      for (pTVar2 = generics.head; pTVar2 != (TypeHandle *)0x0; pTVar2 = pTVar2->next) {
        pcVar17 = ", ";
        if (pTVar2 == generics.head) {
          pcVar17 = "";
        }
        iVar13 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar1 - (int)pcVar22) + errorBufSize),"%s%.*s",
                                    pcVar17,(ulong)(uint)(*(int *)&(pTVar2->type->name).end -
                                                         (int)(pTVar2->type->name).begin));
        pcVar22 = pcVar22 + iVar13;
      }
      size = (size_t)((iVar1 - (int)pcVar22) + errorBufSize);
      pcVar17 = ">(";
    }
    iVar13 = NULLC::SafeSprintf(pcVar22,size,pcVar17);
    pcVar22 = pcVar22 + iVar13;
    if (arguments.count != 0) {
      lVar24 = 0;
      uVar19 = 0;
      do {
        pcVar17 = ", ";
        if (lVar24 == 0) {
          pcVar17 = "";
        }
        lVar3 = *(long *)((long)&(arguments.data)->type + lVar24);
        iVar13 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar1 - (int)pcVar22) + errorBufSize),"%s%.*s",
                                    pcVar17,(ulong)(uint)(*(int *)(lVar3 + 0x18) -
                                                         (int)*(undefined8 *)(lVar3 + 0x10)));
        pcVar22 = pcVar22 + iVar13;
        uVar19 = uVar19 + 1;
        lVar24 = lVar24 + 0x30;
      } while (uVar19 < arguments.count);
    }
    pcVar17 = ")\n";
    if (functions.count == 0) {
      pcVar17 = ")";
    }
    iVar13 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar1 - (int)pcVar22) + errorBufSize),pcVar17);
    errorBuf = pcVar22 + iVar13;
  }
  if (functions.count != 0) {
    pcVar22 = " candidates are:\n";
    if (bestRating == 0xffffffff) {
      pcVar22 = " the only available are:\n";
    }
    iVar13 = NULLC::SafeSprintf(errorBuf,(ulong)((iVar1 - (int)errorBuf) + errorBufSize),pcVar22);
    errorBuf = errorBuf + iVar13;
  }
  if (functions.count != 0) {
    uVar19 = 0;
    do {
      function = functions.data[uVar19].function;
      if ((ulong)ratings.count == 0) {
LAB_0017619d:
        pTVar4 = function->type->returnType;
        pcVar22 = (pTVar4->name).begin;
        pcVar17 = (function->name->name).begin;
        iVar13 = NULLC::SafeSprintf(errorBuf,(ulong)((iVar1 - (int)errorBuf) + errorBufSize),
                                    "  %.*s %.*s",
                                    (ulong)(uint)(*(int *)&(pTVar4->name).end - (int)pcVar22),
                                    pcVar22,(ulong)(uint)(*(int *)&(function->name->name).end -
                                                         (int)pcVar17),pcVar17);
        pEVar20 = (ExpressionContext *)(errorBuf + iVar13);
        if ((function->generics).head != (MatchData *)0x0) {
          index = 0;
          iVar13 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar1 - (int)pEVar20) + errorBufSize)
                                      ,"<");
          pcVar22 = (char *)((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
          while( true ) {
            pMVar14 = (function->generics).head;
            uVar16 = 0;
            if (pMVar14 != (MatchData *)0x0) {
              uVar16 = 0;
              do {
                uVar16 = uVar16 + 1;
                pMVar14 = pMVar14->next;
              } while (pMVar14 != (MatchData *)0x0);
            }
            if (uVar16 <= index) break;
            pMVar14 = IntrusiveList<MatchData>::operator[](&function->generics,index);
            pcVar18 = ", ";
            if (index == 0) {
              pcVar18 = "";
            }
            pcVar5 = (pMVar14->type->name).begin;
            iVar13 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar1 - (int)pcVar22) + errorBufSize),
                                        "%s%.*s",pcVar18,
                                        (ulong)(uint)(*(int *)&(pMVar14->type->name).end -
                                                     (int)pcVar5),pcVar5,pcVar17);
            pcVar22 = pcVar22 + iVar13;
            index = index + 1;
          }
          iVar13 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar1 - (int)pcVar22) + errorBufSize),">");
          pEVar20 = (ExpressionContext *)(pcVar22 + iVar13);
        }
        this = pEVar20;
        iVar13 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar1 - (int)pEVar20) + errorBufSize),
                                    "(");
        pEVar20 = (ExpressionContext *)
                  ((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
        if ((function->arguments).count != 0) {
          lVar24 = 0;
          uVar21 = 0;
          do {
            pAVar6 = (function->arguments).data;
            pcVar22 = ", ";
            if (lVar24 == 0) {
              pcVar22 = "";
            }
            pcVar17 = "";
            if ((&pAVar6->isExplicit)[lVar24] != false) {
              pcVar17 = "explicit ";
            }
            lVar3 = *(long *)((long)&pAVar6->type + lVar24);
            uVar7 = *(undefined8 *)(lVar3 + 0x10);
            this = pEVar20;
            iVar13 = NULLC::SafeSprintf((char *)pEVar20,
                                        (ulong)((iVar1 - (int)pEVar20) + errorBufSize),"%s%s%.*s",
                                        pcVar22,pcVar17,
                                        (ulong)(uint)(*(int *)(lVar3 + 0x18) - (int)uVar7),uVar7);
            pEVar20 = (ExpressionContext *)
                      ((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
            uVar21 = uVar21 + 1;
            lVar24 = lVar24 + 0x30;
          } while (uVar21 < (function->arguments).count);
        }
        bVar12 = ExpressionContext::IsGenericFunction(this,function);
        iVar13 = (int)pEVar20;
        if (showInstanceInfo && bVar12) {
          if (functions.count <= uVar19) {
            pcVar22 = "T &ArrayView<FunctionValue>::operator[](unsigned int) [T = FunctionValue]";
LAB_001767e5:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x22a,pcVar22);
          }
          local_150 = functions.data;
          pTVar8 = (TypeStruct *)(functions.data[uVar19].context)->type;
          parentType = (ScopeData *)function->scope->ownerType;
          if (pTVar8 == ctx->typeAutoRef) {
            if (parentType == (ScopeData *)0x0) {
              __assert_fail("function->scope->ownerType",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x1975,
                            "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                           );
            }
          }
          else if (parentType == (ScopeData *)0x0) {
            parentType = (ScopeData *)0x0;
          }
          else {
            parentType = pTVar8->typeScope;
          }
          local_168.head = (MatchData *)0x0;
          local_168.tail = (MatchData *)0x0;
          pAVar9 = ctx->allocator;
          memset(local_148.little,0,0x100);
          local_148.count = 0;
          local_148.max = 0x10;
          uVar10 = (function->arguments).data;
          uVar11 = (function->arguments).count;
          functionArguments.count = uVar11;
          functionArguments.data = (ArgumentData *)uVar10;
          functionArguments._12_4_ = 0;
          arguments_01._12_4_ = 0;
          arguments_01.data = (ArgumentData *)SUB128(arguments._0_12_,0);
          arguments_01.count = SUB124(arguments._0_12_,8);
          local_148.data = local_148.little;
          local_148.allocator = pAVar9;
          bVar12 = PrepareArgumentsForFunctionCall
                             (ctx,source,functionArguments,arguments_01,&local_148,(uint *)0x0,false
                             );
          if ((bVar12) &&
             (((TypeStruct *)(local_150[uVar19].context)->type != ctx->typeAutoRef ||
              (generics.head == (TypeHandle *)0x0)))) {
            arguments_02.count = local_148.count;
            arguments_02.data = local_148.data;
            arguments_02._12_4_ = 0;
            instance = GetGenericFunctionInstanceType
                                 (ctx,source,(TypeBase *)parentType,function,arguments_02,&local_168
                                 );
            if (instance == (TypeFunction *)0x0) {
              iVar13 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar1 - iVar13) + errorBufSize),
                                          ") (wasn\'t instanced here)");
            }
            else {
              arguments_00.count = local_148.count;
              arguments_00.data = local_148.data;
              arguments_00._12_4_ = 0;
              GetFunctionRating(ctx,function,instance,arguments_00);
              pTVar4 = function->type->returnType;
              pcVar22 = (pTVar4->name).begin;
              pcVar17 = (function->name->name).begin;
              iVar13 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar1 - iVar13) + errorBufSize),
                                          ") instanced to\n    %.*s %.*s(",
                                          (ulong)(uint)(*(int *)&(pTVar4->name).end - (int)pcVar22),
                                          pcVar22,(ulong)(uint)(*(int *)&(function->name->name).end
                                                               - (int)pcVar17),pcVar17);
              pEVar20 = (ExpressionContext *)
                        ((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
              if ((function->arguments).count != 0) {
                pIVar23 = &instance->arguments;
                lVar24 = 0;
                uVar21 = 0;
                do {
                  pcVar22 = ", ";
                  pcVar18 = "";
                  if (lVar24 == 0) {
                    pcVar22 = "";
                  }
                  pTVar2 = pIVar23->head;
                  if ((&((function->arguments).data)->isExplicit)[lVar24] != false) {
                    pcVar18 = "explicit ";
                  }
                  pTVar4 = pTVar2->type;
                  pcVar17 = (pTVar4->name).begin;
                  iVar13 = NULLC::SafeSprintf((char *)pEVar20,
                                              (ulong)((iVar1 - (int)pEVar20) + errorBufSize),
                                              "%s%s%.*s",pcVar22,pcVar18,
                                              (ulong)(uint)(*(int *)&(pTVar4->name).end -
                                                           (int)pcVar17),pcVar17);
                  pEVar20 = (ExpressionContext *)
                            ((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
                  pIVar23 = (IntrusiveList<TypeHandle> *)&pTVar2->next;
                  uVar21 = uVar21 + 1;
                  lVar24 = lVar24 + 0x30;
                } while (uVar21 < (function->arguments).count);
              }
              uVar21 = (ulong)((iVar1 - (int)pEVar20) + errorBufSize);
              if (local_168.head == (MatchData *)0x0) {
                iVar13 = NULLC::SafeSprintf((char *)pEVar20,uVar21,")");
              }
              else {
                iVar13 = NULLC::SafeSprintf((char *)pEVar20,uVar21,") with [");
                pEVar20 = (ExpressionContext *)
                          ((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
                for (pMVar14 = local_168.head;
                    uVar21 = (ulong)((iVar1 - (int)pEVar20) + errorBufSize),
                    pMVar14 != (MatchData *)0x0; pMVar14 = pMVar14->next) {
                  pcVar22 = ", ";
                  if (pMVar14 == local_168.head) {
                    pcVar22 = "";
                  }
                  pcVar18 = (pMVar14->name->name).begin;
                  pcVar5 = (pMVar14->type->name).begin;
                  pcVar17 = (char *)CONCAT44((int)((ulong)pcVar17 >> 0x20),
                                             *(int *)&(pMVar14->type->name).end - (int)pcVar5);
                  iVar13 = NULLC::SafeSprintf((char *)pEVar20,uVar21,"%s%.*s = %.*s",pcVar22,
                                              (ulong)(uint)(*(int *)&(pMVar14->name->name).end -
                                                           (int)pcVar18),pcVar18,pcVar17,pcVar5);
                  pEVar20 = (ExpressionContext *)
                            ((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
                }
                iVar13 = NULLC::SafeSprintf((char *)pEVar20,uVar21,"]");
              }
            }
          }
          else {
            iVar13 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar1 - iVar13) + errorBufSize),
                                        ") (wasn\'t instanced here)");
          }
          pcVar22 = (char *)((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
          SmallArray<CallArgumentData,_16U>::~SmallArray(&local_148);
        }
        else {
          iVar13 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar1 - iVar13) + errorBufSize),")");
          pcVar22 = (char *)((long)(pEVar20->uniqueDependencies).little + (long)iVar13 + -0x30);
        }
        iVar13 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar1 - (int)pcVar22) + errorBufSize),"\n");
        errorBuf = pcVar22 + iVar13;
      }
      else {
        if (ratings.count <= uVar19) {
          pcVar22 = "T &ArrayView<unsigned int>::operator[](unsigned int) [T = unsigned int]";
          goto LAB_001767e5;
        }
        if (ratings.data[uVar19] == bestRating) goto LAB_0017619d;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < functions.count);
  }
  pcVar22 = ctx->errorBufLocation;
  sVar15 = strlen(pcVar22);
  pcVar22 = pcVar22 + sVar15;
  ctx->errorBufLocation = pcVar22;
  anon_unknown.dwarf_c6b42::AddErrorInfoWithLocation(ctx,&ctx->errorInfo,source,local_158,pcVar22);
  return;
}

Assistant:

void ReportOnFunctionSelectError(ExpressionContext &ctx, SynBase *source, char* errorBuf, unsigned errorBufSize, const char *messageStart, InplaceStr functionName, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, ArrayView<unsigned> ratings, unsigned bestRating, bool showInstanceInfo)
{
	assert(errorBuf);

	char *errPos = errorBuf;

	if(!functionName.empty())
	{
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s", FMT_ISTR(functionName));

		if(!generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(TypeHandle *el = generics.head; el; el = el->next)
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", el != generics.head ? ", " : "", FMT_ISTR(el->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">(");
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), !functions.empty() ? ")\n" : ")");
	}

	if(!functions.empty())
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), bestRating == ~0u ? " the only available are:\n" : " candidates are:\n");

	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i].function;

		if(!ratings.empty() && ratings[i] != bestRating)
			continue;

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s %.*s", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

		if(!function->generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(unsigned k = 0; k < function->generics.size(); k++)
			{
				MatchData *match = function->generics[k];

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", k != 0 ? ", " : "", FMT_ISTR(match->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");

		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name));
		}

		if(ctx.IsGenericFunction(function) && showInstanceInfo)
		{
			TypeBase *parentType = NULL;

			if(functions[i].context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(functions[i].context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;
			SmallArray<CallArgumentData, 16> result(ctx.allocator);

			// Handle named argument order, default argument values and variadic functions
			if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false) || (functions[i].context->type == ctx.typeAutoRef && !generics.empty()))
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
			else if(TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases))
			{
				GetFunctionRating(ctx, function, instance, result);

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") instanced to\n    %.*s %.*s(", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

				TypeHandle *curr = instance->arguments.head;

				for(unsigned k = 0; k < function->arguments.size(); k++)
				{
					ArgumentData &argument = function->arguments[k];

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(curr->type->name));

					curr = curr->next;
				}

				if(!aliases.empty())
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") with [");

					for(MatchData *curr = aliases.head; curr; curr = curr->next)
						errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "]");
				}
				else
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
				}
			}
			else
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\n");
	}

	ctx.errorBufLocation += strlen(ctx.errorBufLocation);

	const char *messageEnd = ctx.errorBufLocation;

	AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
}